

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::StatementSyntax::setChild(StatementSyntax *this,size_t index,TokenOrSyntax child)

{
  NamedLabelSyntax *pNVar1;
  SyntaxNode *pSVar2;
  long in_RSI;
  long in_RDI;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffd8;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *this_00;
  
  this_00 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&stack0x00000008;
  if (in_RSI == 0) {
    pSVar2 = TokenOrSyntax::node((TokenOrSyntax *)0x520f9a);
    if (pSVar2 == (SyntaxNode *)0x0) {
      pNVar1 = (NamedLabelSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node((TokenOrSyntax *)0x520faa);
      pNVar1 = SyntaxNode::as<slang::syntax::NamedLabelSyntax>(pSVar2);
    }
    *(NamedLabelSyntax **)(in_RDI + 0x18) = pNVar1;
  }
  else {
    pSVar2 = TokenOrSyntax::node((TokenOrSyntax *)0x520fd9);
    SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>(pSVar2);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=(this_00,in_stack_ffffffffffffffd8)
    ;
  }
  return;
}

Assistant:

void StatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        default: SLANG_UNREACHABLE;
    }
}